

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::buildingCodeHuffman(BMP *this)

{
  HuffmanTree *pHVar1;
  size_type sVar2;
  const_reference ppHVar3;
  allocator local_b1;
  string local_b0 [8];
  string code;
  HuffmanTree *root;
  HuffmanTree *root_1;
  HuffmanTree *r;
  HuffmanTree *l;
  HuffmanTree *obj;
  int i;
  vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_> local_58;
  undefined1 local_38 [8];
  priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
  qu;
  anon_class_1_0_00000001 comp;
  BMP *this_local;
  
  local_58.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>::vector(&local_58);
  std::
  priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
  ::priority_queue((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                    *)local_38,(anon_class_1_0_00000001 *)&qu.field_0x1f,&local_58);
  std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>::~vector(&local_58);
  for (obj._0_4_ = 0; (int)obj < this->alphabet->num; obj._0_4_ = (int)obj + 1) {
    pHVar1 = (HuffmanTree *)operator_new(0x30);
    bitMap::HuffmanTree::HuffmanTree
              (pHVar1,this->alphabet->symbol[(int)obj].frq,(int)obj,(HuffmanTree *)0x0,
               (HuffmanTree *)0x0);
    l = pHVar1;
    std::__cxx11::string::operator=((string *)&this->alphabet->symbol[(int)obj].codeHuffman,"");
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::push((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
            *)local_38,&l);
  }
  while (sVar2 = std::
                 priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
                 ::size((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                         *)local_38), 1 < sVar2) {
    ppHVar3 = std::
              priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
              ::top((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                     *)local_38);
    r = *ppHVar3;
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::pop((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
           *)local_38);
    ppHVar3 = std::
              priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
              ::top((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                     *)local_38);
    root_1 = *ppHVar3;
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::pop((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
           *)local_38);
    pHVar1 = (HuffmanTree *)operator_new(0x30);
    bitMap::HuffmanTree::HuffmanTree(pHVar1,r,root_1);
    root = pHVar1;
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::push((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
            *)local_38,&root);
  }
  ppHVar3 = std::
            priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
            ::top((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                   *)local_38);
  pHVar1 = *ppHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  fun(this,pHVar1,(string *)local_b0);
  del(pHVar1);
  std::__cxx11::string::~string(local_b0);
  std::
  priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
  ::~priority_queue((priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
                     *)local_38);
  return;
}

Assistant:

void BMP::buildingCodeHuffman()
{
    using namespace bitMap;
    using namespace std;

    auto comp = []( HuffmanTree *a, HuffmanTree*b ){ return a->frq > b->frq; };

    priority_queue< HuffmanTree*, vector< HuffmanTree* >, decltype( comp ) > qu(comp);

    for ( auto i = 0; i < alphabet->num; i++ ){
        HuffmanTree *obj = new HuffmanTree( alphabet->symbol[ i ].frq, i, nullptr, nullptr );
        alphabet->symbol[ i ].codeHuffman = "";
        qu.push( obj );
    }


    while( qu.size() > 1 ){
        HuffmanTree *l = qu.top();
        qu.pop();
        HuffmanTree *r = qu.top();
        qu.pop();

        HuffmanTree *root = new HuffmanTree( l ,r );

        qu.push(root);
    }

    HuffmanTree *root = qu.top();

    string code = "";
    fun( root, code );
    del( root );
}